

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::BaseBuilder::embedConstPool(BaseBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  EmbedDataNode *in_RAX;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *dst;
  EmbedDataNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar2 = 5;
  }
  else {
    node = in_RAX;
    bVar1 = BaseEmitter::isLabelValid
                      (&this->super_BaseEmitter,(label->super_Operand).super_Operand_._baseId);
    if (!bVar1) {
      EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,0xc,(char *)0x0);
      return EVar2;
    }
    EVar2 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[9])(this,1,(ulong)(uint)pool->_alignment);
    if (((EVar2 == 0) &&
        (EVar2 = (*(this->super_BaseEmitter)._vptr_BaseEmitter[6])(this,label), EVar2 == 0)) &&
       (EVar2 = newEmbedDataNode(this,&node,kUInt8,(void *)0x0,pool->_size,1), EVar2 == 0)) {
      if ((ulong)(node->super_BaseNode).field_1._any._reserved1 * node->_itemCount < 0x41) {
        dst = &node->field_2;
      }
      else {
        dst = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)(node->field_2)._externalData;
      }
      ConstPool::fill(pool,dst);
      addNode(this,&node->super_BaseNode);
    }
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!isLabelValid(label))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(newEmbedDataNode(&node, TypeId::kUInt8, nullptr, pool.size()));
  ASMJIT_ASSUME(node != nullptr);

  pool.fill(node->data());
  addNode(node);
  return kErrorOk;
}